

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::
     log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
               (char *file,char line [7],LogSeverity severity,char *macroArgs,char (*params) [49],
               DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *params_1)

{
  undefined4 in_register_00000014;
  long lVar1;
  char argValues [2] [7];
  
  str<char_const(&)[49]>
            ((String *)argValues,(kj *)params,(char (*) [49])CONCAT44(in_register_00000014,severity)
            );
  str<kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
            ((DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)
             &stack0xffffffffffffffc0);
  logInternal((Debug *)file,(char *)(ulong)line._0_4_,severity,(LogSeverity)macroArgs,argValues[0],
              _argValues);
  lVar1 = 0x18;
  do {
    Array<char>::~Array((Array<char> *)(argValues[0] + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}